

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O2

void calculateLH(int n_vert,vec3f *position,vec3f *normal,float *LHbuffer,char *light_obj_file)

{
  vec3f *b;
  data_t dVar1;
  int i;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  vec3f *pvVar5;
  int _;
  int iVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  vec3f vVar9;
  vec3f vVar10;
  vec3f local_1f28;
  float local_1f1c;
  undefined1 local_1f18 [16];
  undefined1 local_1f08 [16];
  vec3f *local_1ef8;
  vec3f *local_1ef0;
  ulong local_1ee8;
  vec3f local_1ee0;
  SampleInfo info;
  string local_1eb8;
  TriangleMesh light;
  float y [225];
  double acc [225];
  MT19937Sampler sampler;
  
  local_1ef8 = position;
  local_1ef0 = normal;
  github111116::ConsoleLogger::log<char[18]>(&console,(char (*) [18])"calculating LH...");
  std::__cxx11::string::string((string *)&local_1eb8,light_obj_file,(allocator *)&sampler);
  TriangleMesh::TriangleMesh(&light,&local_1eb8);
  std::__cxx11::string::~string((string *)&local_1eb8);
  local_1ee8 = 0;
  if (0 < n_vert) {
    local_1ee8 = (ulong)(uint)n_vert;
  }
  for (uVar2 = 0; uVar2 != local_1ee8; uVar2 = uVar2 + 1) {
    if ((int)((uVar2 & 0xffffffff) % 100) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"\r    LH progress: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar2);
      poVar3 = std::operator<<(poVar3,"/");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
      std::operator<<(poVar3,"          ");
    }
    sampler.super_Sampler._vptr_Sampler = (_func_int **)&PTR_get1f_001aec00;
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&sampler.generator,0);
    memset(acc,0,0x708);
    b = local_1ef8 + uVar2;
    pvVar5 = local_1ef0 + uVar2;
    for (iVar6 = 0; iVar6 != 100; iVar6 = iVar6 + 1) {
      BasicContainer::sampleSurface(&info,&light.super_BasicContainer,&sampler.super_Sampler);
      vVar9 = operator-(&info.p,b);
      local_1ee0.z = vVar9.z;
      local_1ee0._0_8_ = vVar9._0_8_;
      vVar9 = normalized(&local_1ee0);
      dVar1 = info.normal.x;
      local_1f28._0_8_ = vVar9._0_8_;
      local_1f18._8_4_ = extraout_XMM0_Dc;
      local_1f18._0_4_ = local_1f28.x;
      local_1f18._4_4_ = local_1f28.y;
      local_1f18._12_4_ = extraout_XMM0_Dd;
      local_1f1c = info.normal.y;
      local_1f08 = ZEXT416((uint)info.normal.z);
      local_1f28.z = vVar9.z;
      vVar10 = operator-(&info.p,b);
      local_1f08._0_4_ =
           (((float)local_1f08._0_4_ * vVar9.z +
            dVar1 * (float)local_1f18._0_4_ + local_1f1c * (float)local_1f18._4_4_) /
           (vVar10.z * vVar10.z + vVar10.x * vVar10.x + vVar10.y * vVar10.y)) / info.pdf;
      fVar8 = pvVar5->y * local_1f28.y;
      local_1f18._0_4_ = pvVar5->x * local_1f28.x;
      fVar7 = pvVar5->z * local_1f28.z;
      SHEvaluate(&local_1f28,0xe,y);
      fVar7 = fVar7 + (float)local_1f18._0_4_ + fVar8;
      if (fVar7 <= 0.0) {
        fVar7 = 0.0;
      }
      for (lVar4 = 0; lVar4 != 0xe1; lVar4 = lVar4 + 1) {
        acc[lVar4] = (double)(y[lVar4] * fVar7 * ABS((float)local_1f08._0_4_)) + acc[lVar4];
      }
    }
    for (lVar4 = 0; lVar4 != 0xe1; lVar4 = lVar4 + 1) {
      LHbuffer[lVar4] = (float)(acc[lVar4] / 100.0);
    }
    LHbuffer = LHbuffer + 0xe1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\r    LH progress: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
  std::operator<<(poVar3,"           \n");
  BasicContainer::~BasicContainer(&light.super_BasicContainer);
  return;
}

Assistant:

void calculateLH(int n_vert, const vec3f* position, const vec3f* normal, float* LHbuffer, const char light_obj_file[])
{
	console.log("calculating LH...");
	TriangleMesh light(light_obj_file);
	for (int vert=0; vert<n_vert; ++vert)
	{
		if (vert%100==0)
			std::cerr << "\r    LH progress: " << vert << "/" << n_vert << "          ";
		// sphfunc LH = [&](vec3f w)
		// {
		// 	Primitive::Hit h;
		// 	if (!light.intersect(Ray(position[i],w), &h)) return 0.0f;
		// 	if (w.y < 0) return 0.0f;
		// 	return std::max(0.0f, dot(normal[i],w));
		// };

	    MT19937Sampler sampler;

	    double acc[N_COEFFS];
    	float y[N_COEFFS];
	    memset(acc, 0, sizeof acc);
	    const int n_sample = 100;
    	for (int _=0; _<n_sample; ++_) {
			auto info = light.sampleSurface(sampler);
			vec3f w = normalized(info.p - position[vert]);
			float irr = dot(info.normal, w) / sqrlen(info.p - position[vert]) / info.pdf;
			irr = fabs(irr);
			irr *= std::max(0.0f, dot(normal[vert],w));
        	SHEvaluate(w, shorder-1, y);
	        for (int i=0; i<N_COEFFS; ++i)
	            acc[i] += irr * y[i];
    	}
    	for (int j=0; j<N_COEFFS; ++j)
    		LHbuffer[vert*N_COEFFS+j] = acc[j] / n_sample;
	}
	std::cerr << "\r    LH progress: " << n_vert << "/" << n_vert << "           \n";
}